

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_text(format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *this,char *begin,char *end)

{
  buffer_appender<char> bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_40;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *local_38;
  buffer_appender<char> *it;
  iterator out;
  type size;
  char *end_local;
  char *begin_local;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *this_local;
  
  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       to_unsigned<long>((long)end - (long)begin);
  it = (buffer_appender<char> *)
       basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(&this->context);
  local_40.container =
       (buffer<char> *)
       reserve<char>((buffer_appender<char>)it,
                     out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  local_38 = &local_40;
  bVar1 = std::copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>
                    (begin,(unsigned_long)
                           out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                     (buffer_appender<char>)local_40.container);
  local_38->container =
       (buffer<char> *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
            (&this->context,(iterator)it);
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }